

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_visit_tag_Test::~visitor_test_should_visit_tag_Test
          (visitor_test_should_visit_tag_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(visitor_test, should_visit_tag)
{
    const char* frame = "8=FIX.4.2|9=84|35=A|34=1|49=ABC|52=20120309-16:54:02|56=TT_ORDER|96=12345678|384=2|372=TEST|385=C|372=TEST|10=248|";

    auto assertFalse = [&](const Fixpp::ErrorKind&) { ASSERT_TRUE(false); };

    Fixpp::visitTag<Fixpp::Tag::MsgType>(frame, std::strlen(frame))
      .then([&](const std::string& msgType) { ASSERT_EQ(msgType, "A"); })
      .otherwise(assertFalse);

    Fixpp::visitTag<Fixpp::Tag::RefMsgType>(frame, std::strlen(frame))
        .then([&](const std::string& ref) { ASSERT_EQ(ref, "TEST"); })
        .otherwise(assertFalse);

    Fixpp::visitTag<Fixpp::Tag::BodyLength>(frame, std::strlen(frame))
        .then([&](int64_t length) { ASSERT_EQ(length, 84); })
        .otherwise(assertFalse);

    Fixpp::visitTag<Fixpp::Tag::OnBehalfOfCompID>(frame, std::strlen(frame))
        .then([&](const std::string&) { ASSERT_TRUE(false); })
        .otherwise([&](const Fixpp::ErrorKind& e) { ASSERT_EQ(e.type(), Fixpp::ErrorKind::UnknownTag); });
}